

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_lock.cpp
# Opt level: O0

bool mpp_spinlock_trylock(spinlock_t *lock)

{
  RK_S64 RVar1;
  bool bVar2;
  RK_S64 RStack_18;
  bool ret;
  RK_S64 time;
  spinlock_t *lock_local;
  
  RStack_18 = 0;
  if (lock->debug != 0) {
    RStack_18 = mpp_time();
  }
  LOCK();
  bVar2 = lock->lock == 0;
  if (bVar2) {
    lock->lock = 1;
  }
  UNLOCK();
  if (((bVar2) && (lock->debug != 0)) && (RStack_18 != 0)) {
    RVar1 = mpp_time();
    lock->time = (RVar1 - RStack_18) + lock->time;
    lock->count = lock->count + 1;
  }
  return bVar2;
}

Assistant:

bool mpp_spinlock_trylock(spinlock_t *lock)
{
    RK_S64 time = 0;
    bool ret;

    if (lock->debug)
        time = mpp_time();

    ret = MPP_BOOL_CAS(&lock->lock, LOCK_IDLE, LOCK_BUSY);

    if (ret && lock->debug && time) {
        lock->time += mpp_time() - time;
        lock->count++;
    }

    return ret;
}